

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OneHotEncoder.pb.cc
# Opt level: O1

void __thiscall
CoreML::Specification::OneHotEncoder::OneHotEncoder(OneHotEncoder *this,OneHotEncoder *from)

{
  void *pvVar1;
  undefined3 uVar2;
  int iVar3;
  Int64Vector *this_00;
  StringVector *this_01;
  Int64Vector *from_00;
  StringVector *from_01;
  
  (this->super_MessageLite)._vptr_MessageLite = (_func_int **)&PTR__OneHotEncoder_003dac40;
  (this->_internal_metadata_).
  super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
  .ptr_ = (void *)0x0;
  this->_cached_size_ = 0;
  pvVar1 = (from->_internal_metadata_).
           super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
           .ptr_;
  if (((ulong)pvVar1 & 1) != 0) {
    google::protobuf::internal::InternalMetadataWithArenaLite::DoMergeFrom
              (&this->_internal_metadata_,(string *)((ulong)pvVar1 & 0xfffffffffffffffe));
  }
  uVar2 = *(undefined3 *)&from->field_0x11;
  iVar3 = from->handleunknown_;
  this->outputsparse_ = from->outputsparse_;
  *(undefined3 *)&this->field_0x11 = uVar2;
  this->handleunknown_ = iVar3;
  this->_oneof_case_[0] = 0;
  if (from->_oneof_case_[0] == 1) {
    clear_CategoryType(this);
    this->_oneof_case_[0] = 1;
    this_01 = (StringVector *)operator_new(0x30);
    StringVector::StringVector(this_01);
    (this->CategoryType_).stringcategories_ = this_01;
    if (from->_oneof_case_[0] == 1) {
      from_01 = (from->CategoryType_).stringcategories_;
    }
    else {
      from_01 = StringVector::default_instance();
    }
    StringVector::MergeFrom(this_01,from_01);
  }
  else if (from->_oneof_case_[0] == 2) {
    clear_CategoryType(this);
    this->_oneof_case_[0] = 2;
    this_00 = (Int64Vector *)operator_new(0x28);
    Int64Vector::Int64Vector(this_00);
    (this->CategoryType_).int64categories_ = this_00;
    if (from->_oneof_case_[0] == 2) {
      from_00 = (from->CategoryType_).int64categories_;
    }
    else {
      from_00 = Int64Vector::default_instance();
    }
    Int64Vector::MergeFrom(this_00,from_00);
  }
  return;
}

Assistant:

OneHotEncoder::OneHotEncoder(const OneHotEncoder& from)
  : ::google::protobuf::MessageLite(),
      _internal_metadata_(NULL),
      _cached_size_(0) {
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  ::memcpy(&outputsparse_, &from.outputsparse_,
    reinterpret_cast<char*>(&handleunknown_) -
    reinterpret_cast<char*>(&outputsparse_) + sizeof(handleunknown_));
  clear_has_CategoryType();
  switch (from.CategoryType_case()) {
    case kStringCategories: {
      mutable_stringcategories()->::CoreML::Specification::StringVector::MergeFrom(from.stringcategories());
      break;
    }
    case kInt64Categories: {
      mutable_int64categories()->::CoreML::Specification::Int64Vector::MergeFrom(from.int64categories());
      break;
    }
    case CATEGORYTYPE_NOT_SET: {
      break;
    }
  }
  // @@protoc_insertion_point(copy_constructor:CoreML.Specification.OneHotEncoder)
}